

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBoxPrivate::returnPressed(QComboBoxPrivate *this)

{
  InsertPolicy IVar1;
  QComboBox *this_00;
  long lVar2;
  long *plVar3;
  char cVar4;
  int iVar5;
  MatchFlags flags;
  int iVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QStringView QVar8;
  QStringView QVar9;
  QString local_b8;
  QIcon local_a0;
  storage_type_conflict *local_98;
  qsizetype local_90;
  QString local_88;
  QString local_70;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->insertPolicy == NoInsert) goto LAB_003df275;
  this_00 = *(QComboBox **)&(this->super_QWidgetPrivate).field_0x8;
  if (this->lineEdit == (QLineEdit *)0x0) {
    bVar7 = false;
  }
  else {
    QLineEdit::text(&local_70,this->lineEdit);
    bVar7 = local_70.d.size != 0;
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (!bVar7) goto LAB_003df275;
  lVar2 = *(long *)&(this_00->super_QWidget).field_0x8;
  plVar3 = *(long **)(lVar2 + 0x298);
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QModelIndex *)&local_58,(QPersistentModelIndex *)(lVar2 + 0x2c0));
  iVar5 = (**(code **)(*plVar3 + 0x78))(plVar3);
  if ((this->maxCount <= iVar5) && (this->insertPolicy != InsertAtCurrent)) goto LAB_003df275;
  QLineEdit::deselect(this->lineEdit);
  QLineEdit::end(this->lineEdit,false);
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text(&local_88,this->lineEdit);
  if ((this->field_0x34c & 2) == 0) {
    flags = matchFlags(this);
    ::QVariant::QVariant((QVariant *)&local_58,(QString *)&local_88);
    iVar5 = QComboBox::findData(this_00,(QVariant *)&local_58,0,flags);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (iVar5 == -1) goto LAB_003deff5;
LAB_003df229:
    QComboBox::setCurrentIndex(this_00,iVar5);
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_58,&this->currentIndex);
    emitActivated(this,(QModelIndex *)&local_58);
  }
  else {
LAB_003deff5:
    switch(this->insertPolicy) {
    case InsertAtTop:
switchD_003df014_caseD_1:
      iVar5 = 0;
      break;
    case InsertAtCurrent:
    case InsertAfterCurrent:
    case InsertBeforeCurrent:
      lVar2 = *(long *)&(this_00->super_QWidget).field_0x8;
      plVar3 = *(long **)(lVar2 + 0x298);
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_58,(QPersistentModelIndex *)(lVar2 + 0x2c0));
      iVar6 = (**(code **)(*plVar3 + 0x78))(plVar3,&local_58);
      iVar5 = 0;
      if ((iVar6 != 0) && (cVar4 = QPersistentModelIndex::isValid(), iVar5 = 0, cVar4 != '\0')) {
        IVar1 = this->insertPolicy;
        if (IVar1 == InsertBeforeCurrent) {
          iVar5 = QPersistentModelIndex::row();
        }
        else {
          if (IVar1 != InsertAfterCurrent) {
            if (IVar1 == InsertAtCurrent) {
              iVar5 = QPersistentModelIndex::row();
              QComboBox::setItemText(this_00,iVar5,&local_88);
            }
            goto switchD_003df014_default;
          }
          iVar5 = QPersistentModelIndex::row();
          iVar5 = iVar5 + 1;
        }
      }
      break;
    case InsertAtBottom:
      iVar5 = QComboBox::count(this_00);
      break;
    case InsertAlphabetically:
      lVar2 = *(long *)&(this_00->super_QWidget).field_0x8;
      plVar3 = *(long **)(lVar2 + 0x298);
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_58,(QPersistentModelIndex *)(lVar2 + 0x2c0));
      iVar5 = (**(code **)(*plVar3 + 0x78))(plVar3,&local_58);
      if (iVar5 < 1) goto switchD_003df014_caseD_1;
      iVar5 = 0;
      do {
        QString::toLower_helper((QString *)local_58.data);
        QComboBox::itemText(&local_b8,this_00,iVar5);
        QString::toLower_helper((QString *)&local_a0);
        QVar8.m_data = (storage_type_conflict *)local_58._8_8_;
        QVar8.m_size = local_58._16_8_;
        QVar9.m_data = local_98;
        QVar9.m_size = local_90;
        iVar6 = QtPrivate::compareStrings(QVar8,QVar9,CaseSensitive);
        if ((QArrayData *)local_a0.d != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_a0.d = *(int *)local_a0.d + -1;
          UNLOCK();
          if (*(int *)local_a0.d == 0) {
            QArrayData::deallocate((QArrayData *)local_a0.d,2,0x10);
          }
        }
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_58.shared = *(int *)local_58.shared + -1;
          UNLOCK();
          if (*(int *)local_58.shared == 0) {
            QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
          }
        }
        if (iVar6 < 0) break;
        iVar5 = iVar5 + 1;
        lVar2 = *(long *)&(this_00->super_QWidget).field_0x8;
        plVar3 = *(long **)(lVar2 + 0x298);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QModelIndex *)&local_58,(QPersistentModelIndex *)(lVar2 + 0x2c0));
        iVar6 = (**(code **)(*plVar3 + 0x78))(plVar3,&local_58);
      } while (iVar5 < iVar6);
      break;
    default:
switchD_003df014_default:
      iVar5 = -1;
    }
    if (-1 < iVar5) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = (storage_type_conflict *)0x0;
      local_58._16_8_ = 0;
      local_40 = 2;
      QIcon::QIcon(&local_a0);
      QComboBox::insertItem(this_00,iVar5,&local_a0,&local_88,(QVariant *)&local_58);
      QIcon::~QIcon(&local_a0);
      ::QVariant::~QVariant((QVariant *)&local_58);
      goto LAB_003df229;
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_003df275:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::returnPressed()
{
    Q_Q(QComboBox);

    // The insertion code below does not apply when the policy is QComboBox::NoInsert.
    // In case a completer is installed, item activation via the completer is handled
    // in completerActivated(). Otherwise editingFinished() updates the current
    // index as appropriate.
    if (insertPolicy == QComboBox::NoInsert)
        return;

    if (lineEdit && !lineEdit->text().isEmpty()) {
        if (q->count() >= maxCount && !(this->insertPolicy == QComboBox::InsertAtCurrent))
            return;
        lineEdit->deselect();
        lineEdit->end(false);
        QString text = lineEdit->text();
        // check for duplicates (if not enabled) and quit
        int index = -1;
        if (!duplicatesEnabled) {
            index = q->findText(text, matchFlags());
            if (index != -1) {
                q->setCurrentIndex(index);
                emitActivated(currentIndex);
                return;
            }
        }
        switch (insertPolicy) {
        case QComboBox::InsertAtTop:
            index = 0;
            break;
        case QComboBox::InsertAtBottom:
            index = q->count();
            break;
        case QComboBox::InsertAtCurrent:
        case QComboBox::InsertAfterCurrent:
        case QComboBox::InsertBeforeCurrent:
            if (!q->count() || !currentIndex.isValid())
                index = 0;
            else if (insertPolicy == QComboBox::InsertAtCurrent)
                q->setItemText(q->currentIndex(), text);
            else if (insertPolicy == QComboBox::InsertAfterCurrent)
                index = q->currentIndex() + 1;
            else if (insertPolicy == QComboBox::InsertBeforeCurrent)
                index = q->currentIndex();
            break;
        case QComboBox::InsertAlphabetically:
            index = 0;
            for (int i = 0; i < q->count(); ++i, ++index) {
                if (text.toLower() < q->itemText(i).toLower())
                    break;
            }
            break;
        default:
            break;
        }
        if (index >= 0) {
            q->insertItem(index, text);
            q->setCurrentIndex(index);
            emitActivated(currentIndex);
        }
    }
}